

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments.cpp
# Opt level: O0

void __thiscall r_comp::Image::build_references(Image *this)

{
  uint uVar1;
  uint uVar2;
  SysObject *sys_object_00;
  size_t sVar3;
  SysObject **ppSVar4;
  uint *puVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  uintptr_t _object;
  size_t i;
  SysObject *sys_object;
  Code *object;
  Image *this_local;
  
  _object = 0;
  while( true ) {
    sVar3 = r_code::vector<r_code::SysObject_*>::size(&(this->code_segment).objects);
    if (sVar3 <= _object) {
      return;
    }
    ppSVar4 = r_code::vector<r_code::SysObject_*>::operator[](&(this->code_segment).objects,_object)
    ;
    sys_object_00 = *ppSVar4;
    sVar3 = r_code::vector<unsigned_int>::size((vector<unsigned_int> *)(sys_object_00 + 0x20));
    if (sVar3 < 2) break;
    puVar5 = r_code::vector<unsigned_int>::operator[]
                       ((vector<unsigned_int> *)(sys_object_00 + 0x20),0);
    uVar1 = *puVar5;
    puVar5 = r_code::vector<unsigned_int>::operator[]
                       ((vector<unsigned_int> *)(sys_object_00 + 0x20),1);
    uVar2 = *puVar5;
    this_00 = r_code::vector<unsigned_int>::as_std((vector<unsigned_int> *)(sys_object_00 + 0x20));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(this_00);
    build_references(this,sys_object_00,(Code *)CONCAT44(uVar2,uVar1));
    _object = _object + 1;
  }
  __assert_fail("sys_object->references.size() >= 2",
                "/workspace/llm4binary/github/license_c_cmakelists/sandsmark[P]replicode/r_comp/segments.cpp"
                ,0x25a,"void r_comp::Image::build_references()");
}

Assistant:

void Image::build_references()
{
    Code *object;
    SysObject *sys_object;

    for (size_t i = 0; i < code_segment.objects.size(); ++i) {
        sys_object = code_segment.objects[i];
        assert(sys_object->references.size() >= 2);
        uintptr_t _object = sys_object->references[0];
        _object |= (uintptr_t(sys_object->references[1]) << 32);
        object = (Code *)_object;
        sys_object->references.as_std()->clear();
        build_references(sys_object, object);
    }
}